

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O2

int SetAllPWMsFromThreadSSC32x(SSC32 *pSSC32,int *selectedchannels,int *pws)

{
  int iVar1;
  long lVar2;
  long lVar3;
  CRITICAL_SECTION *__mutex;
  int *piVar4;
  long lVar5;
  long lVar6;
  byte bVar7;
  
  bVar7 = 0;
  __mutex = SSC32CS;
  lVar6 = 0;
  lVar5 = 0;
  do {
    if (*(SSC32 **)((long)addrsSSC32 + lVar6 * 2) == pSSC32) {
      pthread_mutex_lock((pthread_mutex_t *)__mutex);
      lVar3 = 0x20;
      piVar4 = (int *)((long)selectedchannelsSSC32[0] + lVar5);
      for (lVar2 = lVar3; lVar2 != 0; lVar2 = lVar2 + -1) {
        *piVar4 = *selectedchannels;
        selectedchannels = selectedchannels + (ulong)bVar7 * -2 + 1;
        piVar4 = piVar4 + (ulong)bVar7 * -2 + 1;
      }
      piVar4 = (int *)((long)pwsSSC32[0] + lVar5);
      for (; lVar3 != 0; lVar3 = lVar3 + -1) {
        *piVar4 = *pws;
        pws = pws + (ulong)bVar7 * -2 + 1;
        piVar4 = piVar4 + (ulong)bVar7 * -2 + 1;
      }
      iVar1 = *(int *)((long)resSSC32 + lVar6);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return iVar1;
    }
    __mutex = __mutex + 1;
    lVar5 = lVar5 + 0x80;
    lVar6 = lVar6 + 4;
  } while (lVar5 != 0x800);
  return 1;
}

Assistant:

HARDWAREX_API int SetAllPWMsFromThreadSSC32x(SSC32* pSSC32, int* selectedchannels, int* pws)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsSSC32[id] != pSSC32)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	EnterCriticalSection(&SSC32CS[id]);
	memcpy(selectedchannelsSSC32[id], selectedchannels, NB_CHANNELS_PWM_SSC32*sizeof(int));
	memcpy(pwsSSC32[id], pws, NB_CHANNELS_PWM_SSC32*sizeof(int));
	res = resSSC32[id];
	LeaveCriticalSection(&SSC32CS[id]);

	return res;
}